

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O2

void __thiscall
CChromeTracer::addQueueMetadata(CChromeTracer *this,uint32_t queueNumber,string *queueName)

{
  ostream *poVar1;
  
  std::mutex::lock(&this->m_Mutex);
  poVar1 = std::operator<<((ostream *)&this->m_TraceFile,
                           "{\"ph\":\"M\",\"name\":\"thread_name\",\"pid\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",\"tid\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,".1,\"args\":{\"name\":\"");
  poVar1 = std::operator<<(poVar1,(string *)queueName);
  std::operator<<(poVar1,"\"}},\n");
  poVar1 = std::operator<<((ostream *)&this->m_TraceFile,
                           "{\"ph\":\"M\",\"name\":\"thread_sort_index\",\"pid\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",\"tid\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,".1,\"args\":{\"sort_index\":\"");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\"}},\n");
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addQueueMetadata(
            uint32_t queueNumber,
            const std::string& queueName )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"thread_name\",\"pid\":" << m_ProcessId
            << ",\"tid\":" << queueNumber
            << ".1,\"args\":{\"name\":\"" << queueName
            << "\"}},\n";
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"thread_sort_index\",\"pid\":" << m_ProcessId
            << ",\"tid\":" << queueNumber
            << ".1,\"args\":{\"sort_index\":\"" << queueNumber
            << "\"}},\n";
    }